

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_constant_aggregator.cpp
# Opt level: O3

void __thiscall
duckdb::WindowConstantAggregator::Evaluate
          (WindowConstantAggregator *this,WindowAggregatorState *gsink,WindowAggregatorState *lstate
          ,DataChunk *bounds,Vector *result,idx_t count,idx_t row_idx)

{
  WindowAggregatorState *sel_p;
  data_ptr_t pdVar1;
  ulong uVar2;
  ulong uVar3;
  type source_p;
  const_reference pvVar4;
  const_reference pvVar5;
  idx_t source_count;
  free_function_ptr_t *this_00;
  idx_t iVar6;
  idx_t iVar7;
  idx_t target_offset;
  
  source_p = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                        &gsink[0xc].allocator.arena_allocator.reallocate_function);
  pvVar4 = vector<duckdb::Vector,_true>::operator[](&bounds->data,6);
  if (count != 0) {
    this_00 = &gsink[6].allocator.arena_allocator.free_function;
    pdVar1 = pvVar4->data;
    sel_p = lstate + 10;
    iVar6 = lstate[9].allocator.allocated_size;
    source_count = 0;
    iVar7 = 0;
    target_offset = 0;
    do {
      uVar2 = *(ulong *)(pdVar1 + iVar7 * 8);
      pvVar5 = vector<unsigned_long,_true>::operator[]
                         ((vector<unsigned_long,_true> *)this_00,iVar6 + 1);
      uVar3 = *pvVar5;
      while (uVar3 <= uVar2) {
        if (source_count != 0) {
          VectorOperations::Copy
                    (source_p,result,(SelectionVector *)sel_p,source_count,0,target_offset);
          target_offset = target_offset + source_count;
        }
        iVar6 = lstate[9].allocator.allocated_size;
        lstate[9].allocator.allocated_size = iVar6 + 1;
        pvVar5 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)this_00,iVar6 + 2);
        source_count = 0;
        uVar3 = *pvVar5;
      }
      iVar6 = lstate[9].allocator.allocated_size;
      *(int *)((long)lstate[10]._vptr_WindowAggregatorState + source_count * 4) = (int)iVar6;
      source_count = source_count + 1;
      iVar7 = iVar7 + 1;
    } while (iVar7 != count);
    if (source_count != 0) {
      if (count == source_count && target_offset == 0) {
        VectorOperations::Copy(source_p,result,(SelectionVector *)sel_p,1,0,0);
        Vector::SetVectorType(result,CONSTANT_VECTOR);
        return;
      }
      VectorOperations::Copy(source_p,result,(SelectionVector *)sel_p,source_count,0,target_offset);
      return;
    }
  }
  return;
}

Assistant:

void WindowConstantAggregator::Evaluate(const WindowAggregatorState &gsink, WindowAggregatorState &lstate,
                                        const DataChunk &bounds, Vector &result, idx_t count, idx_t row_idx) const {
	auto &gasink = gsink.Cast<WindowConstantAggregatorGlobalState>();
	const auto &partition_offsets = gasink.partition_offsets;
	const auto &results = *gasink.results;

	auto begins = FlatVector::GetData<const idx_t>(bounds.data[FRAME_BEGIN]);
	//	Chunk up the constants and copy them one at a time
	auto &lcstate = lstate.Cast<WindowConstantAggregatorLocalState>();
	idx_t matched = 0;
	idx_t target_offset = 0;
	for (idx_t i = 0; i < count; ++i) {
		const auto begin = begins[i];
		//	Find the partition containing [begin, end)
		while (partition_offsets[lcstate.partition + 1] <= begin) {
			//	Flush the previous partition's data
			if (matched) {
				VectorOperations::Copy(results, result, lcstate.matches, matched, 0, target_offset);
				target_offset += matched;
				matched = 0;
			}
			++lcstate.partition;
		}

		lcstate.matches.set_index(matched++, lcstate.partition);
	}

	//	Flush the last partition
	if (matched) {
		// Optimize constant result
		if (target_offset == 0 && matched == count) {
			VectorOperations::Copy(results, result, lcstate.matches, 1, 0, target_offset);
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
		} else {
			VectorOperations::Copy(results, result, lcstate.matches, matched, 0, target_offset);
		}
	}
}